

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSetInner::ToComplement
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint base,
          CharSet<char16_t> *result)

{
  code *pcVar1;
  ArenaAllocator *allocator_00;
  bool bVar2;
  Char lc;
  Char hc;
  uint uVar3;
  undefined4 *puVar4;
  uint *puVar5;
  uint local_30;
  uint i;
  uint delta;
  CharSet<char16_t> *result_local;
  uint base_local;
  uint level_local;
  ArenaAllocator *allocator_local;
  CharSetInner *this_local;
  
  result_local._0_4_ = base;
  result_local._4_4_ = level;
  _base_local = allocator;
  allocator_local = (ArenaAllocator *)this;
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x228,"(level > 0)","level > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  result_local._4_4_ = result_local._4_4_ - 1;
  uVar3 = CharSetNode::lim(result_local._4_4_);
  for (local_30 = 0; allocator_00 = _base_local, local_30 < 0x10; local_30 = local_30 + 1) {
    if (this->children[local_30] == (CharSetNode *)0x0) {
      puVar5 = max<unsigned_int>((uint *)&result_local,&CharSetNode::directSize);
      lc = Chars<char16_t>::UTC(*puVar5);
      hc = Chars<char16_t>::UTC(((uint)result_local + uVar3 + 1) - 1);
      CharSet<char16_t>::SetRange(result,allocator_00,lc,hc);
    }
    else {
      (*this->children[local_30]->_vptr_CharSetNode[6])
                (this->children[local_30],_base_local,(ulong)result_local._4_4_,
                 (ulong)(uint)result_local,result);
    }
    result_local._0_4_ = uVar3 + 1 + (uint)result_local;
  }
  return;
}

Assistant:

void CharSetInner::ToComplement(ArenaAllocator* allocator, uint level, uint base, CharSet<Char>& result) const
    {
        Assert(level > 0);
        level--;
        uint delta = lim(level) + 1;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] == nullptr)
                // Caution: Part of the range for this child may overlap with direct vector
                result.SetRange(allocator, UTC(max(base, directSize)), UTC(base + delta - 1));
            else
                children[i]->ToComplement(allocator, level, base, result);
            base += delta;
        }
    }